

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O3

int lj_cf_ffi_string(lua_State *L)

{
  TValue *o;
  int32_t iVar1;
  char *in_RAX;
  GCstr *pGVar2;
  ulong uVar3;
  size_t lenx;
  CTState *cts;
  char *p;
  char *local_38;
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  o = L->base;
  if (o < L->top) {
    local_38 = in_RAX;
    if ((o + 1 < L->top) && (*(int *)((long)o + 0xc) != -1)) {
      iVar1 = ffi_checkint(L,2);
      lenx = (size_t)iVar1;
      lj_cconv_ct_tv(cts,cts->tab + 0x12,(uint8_t *)&local_38,o,0x100);
    }
    else {
      lj_cconv_ct_tv(cts,cts->tab + 0x13,(uint8_t *)&local_38,o,0x100);
      lenx = strlen(local_38);
    }
    L->top = o + 1;
    pGVar2 = lj_str_new(L,local_38,lenx);
    (o->u32).lo = (uint32_t)pGVar2;
    (o->field_2).it = 0xfffffffb;
    uVar3 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar3 + 0x24) <= *(uint *)(uVar3 + 0x20)) {
      lj_gc_step(L);
    }
    return 1;
  }
  lj_err_arg(L,1,LJ_ERR_NOVAL);
}

Assistant:

LJLIB_CF(ffi_string)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  TValue *o = lj_lib_checkany(L, 1);
  const char *p;
  size_t len;
  if (o+1 < L->top && !tvisnil(o+1)) {
    len = (size_t)ffi_checkint(L, 2);
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CVOID), (uint8_t *)&p, o,
		   CCF_ARG(1));
  } else {
    lj_cconv_ct_tv(cts, ctype_get(cts, CTID_P_CCHAR), (uint8_t *)&p, o,
		   CCF_ARG(1));
    len = strlen(p);
  }
  L->top = o+1;  /* Make sure this is the last item on the stack. */
  setstrV(L, o, lj_str_new(L, p, len));
  lj_gc_check(L);
  return 1;
}